

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O0

void set_default_parameters(opj_decompress_parameters *parameters)

{
  opj_decompress_parameters *parameters_local;
  
  if (parameters != (opj_decompress_parameters *)0x0) {
    memset(parameters,0,0x5090);
    parameters->decod_format = -1;
    parameters->cod_format = -1;
    opj_set_default_decoder_parameters(parameters);
  }
  return;
}

Assistant:

static void set_default_parameters(opj_decompress_parameters* parameters)
{
    if (parameters) {
        memset(parameters, 0, sizeof(opj_decompress_parameters));

        /* default decoding parameters (command line specific) */
        parameters->decod_format = -1;
        parameters->cod_format = -1;

        /* default decoding parameters (core) */
        opj_set_default_decoder_parameters(&(parameters->core));
    }
}